

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.hh
# Opt level: O1

bool __thiscall
dtc::fdt::checking::property_type_checker<(dtc::fdt::property_value::value_type)0>::check
          (property_type_checker<(dtc::fdt::property_value::value_type)0> *this,device_tree *param_1
          ,node_ptr *param_2,property_ptr *p)

{
  element_type *peVar1;
  pointer ppVar2;
  pointer this_00;
  bool bVar3;
  
  peVar1 = (p->super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (peVar1->values).
            super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (peVar1->values).
           super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar3 = this_00 == ppVar2;
    if (bVar3) {
LAB_0011dc8a:
      peVar1 = (p->super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      return (peVar1->values).
             super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (peVar1->values).
             super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (this_00->type == UNKNOWN) {
      property_value::resolve_type(this_00);
    }
    if (this_00->type != STRING) {
      if (this_00->type == UNKNOWN) {
        property_value::resolve_type(this_00);
      }
      if (this_00->type != STRING_LIST) {
        if (!bVar3) {
          return false;
        }
        goto LAB_0011dc8a;
      }
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

virtual bool check(device_tree *, const node_ptr &, property_ptr p)
	{
		for (property::value_iterator i=p->begin(),e=p->end() ; i!=e ;
		     ++i)
		{
			if (!(i->is_string() || i->is_string_list()))
			{
				return false;
			}
		}
		return p->begin() != p->end();
	}